

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  ulong uVar1;
  undefined8 *puVar2;
  byte bVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  iterator __position;
  byte bVar7;
  ulong uVar8;
  undefined8 *puVar9;
  uint uVar10;
  bool bVar11;
  bool IsLast;
  bool local_6d;
  uint local_6c;
  DeviceTy *local_68;
  void **local_60;
  undefined8 *local_58;
  pthread_mutex_t *local_50;
  void **local_48;
  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
  *local_40;
  _Base_ptr local_38;
  
  local_50 = (pthread_mutex_t *)&Device->ShadowMtx;
  local_40 = (_Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
              *)&Device->ShadowPtrMap;
  local_38 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar8 = (ulong)(uint)arg_num;
  local_6c = 0;
  local_68 = Device;
  local_48 = args_base;
  do {
    do {
      do {
        if ((int)uVar8 < 1) {
          return local_6c;
        }
        uVar1 = arg_sizes[uVar8 - 1];
        uVar8 = uVar8 - 1;
      } while ((uVar1 & 0x180) != 0);
      local_58 = (undefined8 *)local_48[uVar8];
      uVar10 = (uint)uVar1;
      ppvVar5 = (void **)DeviceTy::getTgtPtrBegin
                                   (local_68,local_58,(int64_t)args[uVar8],&local_6d,
                                    (bool)((byte)((uVar10 & 0x10) >> 4) | uVar1 >> 0x30 == 0));
      uVar1 = arg_sizes[uVar8];
      bVar3 = (byte)(((uint)uVar1 & 0x10) >> 4) | uVar1 >> 0x30 == 0;
      bVar7 = ((byte)((uVar10 & 8) >> 3) | local_6d) & bVar3;
    } while (((uVar1 & 2) == 0) && (bVar7 == 0));
    if ((uVar1 & 2) != 0) {
      if (bVar3 == 0) {
        local_60 = ppvVar5;
        lVar6 = DeviceTy::getMapEntryRefCnt
                          (local_68,local_48[(long)(uVar1 - 0x1000000000000) >> 0x30]);
        bVar11 = lVar6 == 1;
        ppvVar5 = local_60;
      }
      else {
        bVar11 = false;
      }
      if ((byte)((byte)(((uint)uVar1 & 4) >> 2) | bVar11 | bVar7) == 1) {
        iVar4 = (*(code *)local_68->RTL->data_retrieve)
                          (local_68->RTLDeviceID,local_58,ppvVar5,args[uVar8]);
        local_6c = local_6c | -(uint)(iVar4 != 0);
      }
    }
    puVar9 = (undefined8 *)((long)args[uVar8] + (long)local_58);
    local_60 = args;
    std::mutex::lock((mutex *)&local_50->__data);
    for (__position._M_node =
              (local_68->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        __position._M_node != local_38;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node)) {
      puVar2 = *(undefined8 **)(__position._M_node + 1);
      if (local_58 <= puVar2) {
        if (puVar9 <= puVar2) break;
        if ((*(byte *)(arg_sizes + uVar8) & 2) != 0) {
          *puVar2 = __position._M_node[1]._M_parent;
        }
        if (bVar7 != 0) {
          std::
          _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
          ::erase_abi_cxx11_(local_40,__position);
        }
      }
    }
    pthread_mutex_unlock(local_50);
    args = local_60;
    if (bVar7 != 0) {
      iVar4 = DeviceTy::deallocTgtPtr
                        (local_68,local_58,(int64_t)local_60[uVar8],SUB41((uVar10 & 8) >> 3,0));
      local_6c = local_6c | -(uint)(iVar4 != 0);
    }
  } while( true );
}

Assistant:

static int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  int rc = OFFLOAD_SUCCESS;
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, arg_sizes[i], IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", arg_sizes[i], DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          short parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, arg_sizes[i]);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            rc = OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + arg_sizes[i];
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          Device.ShadowPtrMap.erase(it);
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, arg_sizes[i], ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          rc = OFFLOAD_FAIL;
        }
      }
    }
  }

  return rc;
}